

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.c
# Opt level: O0

int crypto_verify_32(uchar *x,uchar *y)

{
  uint differentbits;
  uchar *y_local;
  uchar *x_local;
  
  return ((byte)(x[0x1f] ^ y[0x1f] |
                x[0x1e] ^ y[0x1e] |
                x[0x1d] ^ y[0x1d] |
                x[0x1c] ^ y[0x1c] |
                x[0x1b] ^ y[0x1b] |
                x[0x1a] ^ y[0x1a] |
                x[0x19] ^ y[0x19] |
                x[0x18] ^ y[0x18] |
                x[0x17] ^ y[0x17] |
                x[0x16] ^ y[0x16] |
                x[0x15] ^ y[0x15] |
                x[0x14] ^ y[0x14] |
                x[0x13] ^ y[0x13] |
                x[0x12] ^ y[0x12] |
                x[0x11] ^ y[0x11] |
                x[0x10] ^ y[0x10] |
                x[0xf] ^ y[0xf] |
                x[0xe] ^ y[0xe] |
                x[0xd] ^ y[0xd] |
                x[0xc] ^ y[0xc] |
                x[0xb] ^ y[0xb] |
                x[10] ^ y[10] |
                x[9] ^ y[9] |
                x[8] ^ y[8] |
                x[7] ^ y[7] |
                x[6] ^ y[6] |
                x[5] ^ y[5] | x[4] ^ y[4] | x[3] ^ y[3] | x[2] ^ y[2] | x[1] ^ y[1] | *x ^ *y) - 1
          >> 8 & 1) - 1;
}

Assistant:

int crypto_verify_32(const unsigned char *x,const unsigned char *y)
{
  unsigned int differentbits = 0;
#define F(i) differentbits |= x[i] ^ y[i];
  F(0)
  F(1)
  F(2)
  F(3)
  F(4)
  F(5)
  F(6)
  F(7)
  F(8)
  F(9)
  F(10)
  F(11)
  F(12)
  F(13)
  F(14)
  F(15)
  F(16)
  F(17)
  F(18)
  F(19)
  F(20)
  F(21)
  F(22)
  F(23)
  F(24)
  F(25)
  F(26)
  F(27)
  F(28)
  F(29)
  F(30)
  F(31)
  return (1 & ((differentbits - 1) >> 8)) - 1;
}